

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O2

void writeHash2<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,SeedType *seed,size_t n1,size_t n2,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *layer1,string *hash_str,string map_name,string *default_value,
               bool nonKeyLookups)

{
  uint16_t seed_00;
  pointer pBVar1;
  uint32_t uVar2;
  int iVar3;
  string *key;
  size_t i;
  ulong uVar4;
  _Alloc_hider _Var5;
  long lVar6;
  pointer pBVar7;
  size_type sVar8;
  string upper_name;
  uint local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  string local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<int,_std::allocator<int>_> mapping;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<writeHash2<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
            ((layer1->
             super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (layer1->
             super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  upper_name._M_dataplus._M_p._0_2_ = 0xffff;
  upper_name._M_dataplus._M_p._2_2_ = 0xffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&mapping,n2 + 1,(value_type_conflict4 *)&upper_name,(allocator_type *)&local_108);
  key = (keys->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(keys->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)key;
  local_e8 = keys;
  for (uVar4 = 0; uVar4 < (ulong)(lVar6 >> 5); uVar4 = uVar4 + 1) {
    uVar2 = hash2(key,seed);
    local_120 = (uint)n1;
    upper_name._M_dataplus._M_p._0_2_ =
         (layer1->
         super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start[uVar2 & local_120].seed;
    uVar2 = hash2(key,(SeedType *)&upper_name);
    mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(uint)n2 & uVar2] = (int)uVar4;
    key = key + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,vals);
  std::__cxx11::string::string((string *)&local_90,(string *)map_name._M_dataplus._M_p);
  getCommonCodeGen<std::__cxx11::string>
            (&upper_name,local_e8,&local_c0,&mapping,n2,&local_90,
             (bool)map_name.field_2._M_local_buf[0]);
  std::__cxx11::string::operator=((string *)hash_str,(string *)&upper_name);
  std::__cxx11::string::~string((string *)&upper_name);
  std::__cxx11::string::~string((string *)&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  std::__cxx11::to_string(&local_e0,n1 + 1);
  std::operator+(&local_108,"    static constexpr std::array<uint16_t, ",&local_e0);
  std::operator+(&upper_name,&local_108,"> seeds {\n        ");
  std::__cxx11::string::append((string *)hash_str);
  std::__cxx11::string::~string((string *)&upper_name);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  pBVar7 = (layer1->
           super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (layer1->
           super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  lVar6 = 0;
  while( true ) {
    if (pBVar7 == pBVar1) break;
    if ((lVar6 != 0) && (lVar6 + (uVar4 / 10) * 10 == 0)) {
      std::__cxx11::string::append((char *)hash_str);
    }
    std::__cxx11::to_string(&local_108,(uint)pBVar7->seed);
    std::operator+(&upper_name,&local_108,",");
    std::__cxx11::string::append((string *)hash_str);
    std::__cxx11::string::~string((string *)&upper_name);
    std::__cxx11::string::~string((string *)&local_108);
    pBVar7 = pBVar7 + 1;
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + -1;
  }
  std::__cxx11::string::append((char *)hash_str);
  seed_00 = *seed;
  _Var5._M_p = map_name._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&local_50,(string *)map_name._M_dataplus._M_p);
  typeStr(&local_70,(string *)_Var5._M_p);
  hashStr2(&upper_name,(string *)_Var5._M_p,seed_00,n1,n2,(string *)map_name._M_string_length,
           &local_50,&local_70,(bool)map_name.field_2._M_local_buf[0]);
  std::__cxx11::string::append((string *)hash_str);
  std::__cxx11::string::~string((string *)&upper_name);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&upper_name,(string *)map_name._M_dataplus._M_p);
  lVar6 = CONCAT44(upper_name._M_dataplus._M_p._4_4_,
                   CONCAT22(upper_name._M_dataplus._M_p._2_2_,(SeedType)upper_name._M_dataplus._M_p)
                  );
  for (sVar8 = 0; upper_name._M_string_length != sVar8; sVar8 = sVar8 + 1) {
    iVar3 = toupper((int)*(char *)(lVar6 + sVar8));
    *(char *)(lVar6 + sVar8) = (char)iVar3;
  }
  std::operator+(&local_e0,"#endif // POIFECT_",&upper_name);
  std::operator+(&local_108,&local_e0,"_H\n");
  std::__cxx11::string::append((string *)hash_str);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&upper_name);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mapping.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void writeHash2(const std::vector<KeyType>& keys,
               const SeedType& seed,
               size_t n1,
               size_t n2,
               const std::vector<std::string>& vals,
               std::vector<Bin<KeyType>> layer1,
               std::string& hash_str,
               std::string map_name,
               const std::string& default_value,
               bool nonKeyLookups){

    struct LayerSort{
        inline bool operator() (const Bin<KeyType>& a, const Bin<KeyType>& b){
            return (a.generating_hash < b.generating_hash);
        }
    };
    std::sort(layer1.begin(), layer1.end(), LayerSort());

    std::vector<int> mapping(n2+1, -1);
    for(size_t i = 0; i < keys.size(); i++){
        const KeyType& key = keys[i];
        uint32_t h = hash2(key, seed) & n1;
        uint32_t s1 = layer1[h].seed;
        size_t final = hash2(key, s1) & n2;
        mapping[final] = i;
    }

    hash_str = getCommonCodeGen(keys, vals, mapping, n2, map_name, nonKeyLookups);

    hash_str += "    static constexpr std::array<uint16_t, " + std::to_string(n1+1) + "> seeds {\n        ";

    size_t i = 0;
    for(const auto& bin : layer1){
        if(i && i%entries_per_row==0) hash_str += "\n        ";
        i++;
        hash_str += std::to_string(bin.seed) + ",";
    }
    hash_str += "\n    };\n\n";

    hash_str += hashStr2(keys[0], seed, n1, n2, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";
}